

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_or_many(size_t number,roaring_bitmap_t **x)

{
  roaring_bitmap_t *prVar1;
  ulong in_RDI;
  size_t i;
  roaring_bitmap_t *answer;
  _Bool in_stack_00000047;
  roaring_bitmap_t *in_stack_00000048;
  roaring_bitmap_t *in_stack_00000050;
  _Bool in_stack_0000007f;
  roaring_bitmap_t *in_stack_00000080;
  roaring_bitmap_t *in_stack_00000088;
  undefined8 local_28;
  roaring_bitmap_t *in_stack_fffffffffffffff8;
  
  if (in_RDI == 0) {
    prVar1 = roaring_bitmap_create();
  }
  else if (in_RDI == 1) {
    prVar1 = roaring_bitmap_copy(in_stack_fffffffffffffff8);
  }
  else {
    prVar1 = roaring_bitmap_lazy_or(in_stack_00000088,in_stack_00000080,in_stack_0000007f);
    for (local_28 = 2; local_28 < in_RDI; local_28 = local_28 + 1) {
      roaring_bitmap_lazy_or_inplace(in_stack_00000050,in_stack_00000048,in_stack_00000047);
    }
    roaring_bitmap_repair_after_lazy((roaring_bitmap_t *)i);
  }
  return prVar1;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many(size_t number,
                                         const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_lazy_or(x[0], x[1], LAZY_OR_BITSET_CONVERSION);
    for (size_t i = 2; i < number; i++) {
        roaring_bitmap_lazy_or_inplace(answer, x[i], LAZY_OR_BITSET_CONVERSION);
    }
    roaring_bitmap_repair_after_lazy(answer);
    return answer;
}